

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

void __thiscall
slang::ast::ForwardingTypedefSymbol::checkType
          (ForwardingTypedefSymbol *this,ForwardTypeRestriction checkRestriction,
          Visibility checkVisibility,SourceLocation declLoc)

{
  Diagnostic *this_00;
  string_view arg;
  
  do {
    if (this->typeRestriction != checkRestriction && this->typeRestriction != None) {
      this_00 = Scope::addDiag((this->super_Symbol).parentScope,(DiagCode)0x90009,
                               (this->super_Symbol).location);
      arg = SemanticFacts::getTypeRestrictionText(this->typeRestriction);
      Diagnostic::operator<<(this_00,arg);
LAB_0034f12b:
      Diagnostic::addNote(this_00,(DiagCode)0x50001,declLoc);
      return;
    }
    if (((this->visibility).super__Optional_base<slang::ast::Visibility,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ast::Visibility>._M_engaged == true) &&
       ((this->visibility).super__Optional_base<slang::ast::Visibility,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ast::Visibility>._M_payload._M_value != checkVisibility)
       ) {
      this_00 = Scope::addDiag((this->super_Symbol).parentScope,(DiagCode)0xa0009,
                               (this->super_Symbol).location);
      goto LAB_0034f12b;
    }
    this = this->next;
    if (this == (ForwardingTypedefSymbol *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void ForwardingTypedefSymbol::checkType(ForwardTypeRestriction checkRestriction,
                                        Visibility checkVisibility, SourceLocation declLoc) const {
    if (typeRestriction != ForwardTypeRestriction::None && typeRestriction != checkRestriction) {
        auto& diag = getParentScope()->addDiag(diag::ForwardTypedefDoesNotMatch, location);
        diag << SemanticFacts::getTypeRestrictionText(typeRestriction);
        diag.addNote(diag::NoteDeclarationHere, declLoc);
        return;
    }

    if (visibility && visibility != checkVisibility) {
        auto& diag = getParentScope()->addDiag(diag::ForwardTypedefVisibility, location);
        diag.addNote(diag::NoteDeclarationHere, declLoc);
        return;
    }

    if (next)
        next->checkType(checkRestriction, checkVisibility, declLoc);
}